

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

int bssl::VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<bssl::VerifyNameMatchSimpleTest> *this_01;
  TestMetaFactoryBase<std::tuple<const_char_*,_const_char_*>_> *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"VerifyNameMatchSimpleTest",&local_29);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_name_match_unittest.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x6a);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<bssl::VerifyNameMatchSimpleTest>(this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<std::tuple<const_char_*,_const_char_*>_> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<bssl::VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test>::
  TestMetaFactory((TestMetaFactory<bssl::VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test> *)
                  meta_factory);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_name_match_unittest.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x6a);
  testing::internal::ParameterizedTestSuiteInfo<bssl::VerifyNameMatchSimpleTest>::AddTestPattern
            (this_01,"VerifyNameMatchSimpleTest","ExtraAttrDoesNotMatch",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(VerifyNameMatchSimpleTest, ExtraAttrDoesNotMatch) {
  std::string der;
  ASSERT_TRUE(LoadTestData("ascii", value_type(), suffix(), &der));
  std::string der_extra_attr;
  ASSERT_TRUE(LoadTestData("ascii", value_type(), suffix() + "-extra_attr",
                           &der_extra_attr));
  EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(der),
                               SequenceValueFromString(der_extra_attr)));
  EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(der_extra_attr),
                               SequenceValueFromString(der)));
}